

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O3

int archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  byte bVar1;
  ushort uVar2;
  uint ocode;
  long *plVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  if (length != 0) {
    plVar3 = (long *)f->data;
    if (*plVar3 == 0) {
      *(uint *)((long)plVar3 + 0x65164) = (uint)*buff;
      *plVar3 = 1;
      length = length - 1;
      if (length == 0) {
        return 0;
      }
      buff = (void *)((long)buff + 1);
    }
    do {
      bVar1 = *buff;
      *plVar3 = *plVar3 + 1;
      ocode = *(uint *)((long)plVar3 + 0x65164);
      uVar4 = (uint)bVar1 << 0x10 | ocode;
      *(uint *)(plVar3 + 0xca2d) = uVar4;
      uVar10 = ocode ^ (uint)bVar1 << 8;
      uVar8 = *(uint *)((long)plVar3 + (long)(int)uVar10 * 4 + 0x24);
      if (uVar8 == uVar4) {
        uVar2 = *(ushort *)((long)plVar3 + (long)(int)uVar10 * 2 + 0x43648);
LAB_00169065:
        *(uint *)((long)plVar3 + 0x65164) = (uint)uVar2;
      }
      else {
        if (-1 < (int)uVar8) {
          iVar5 = uVar10 - 0x10d89;
          if ((uint)bVar1 << 8 == ocode) {
            iVar5 = -1;
          }
          do {
            uVar8 = uVar10 + iVar5;
            uVar10 = uVar10 + 0x10d89 + iVar5;
            if (-1 < (int)uVar8) {
              uVar10 = uVar8;
            }
            uVar8 = *(uint *)((long)plVar3 + 0x24 + (long)(int)uVar10 * 4);
            if (uVar8 == uVar4) {
              uVar2 = *(ushort *)((long)plVar3 + (long)(int)uVar10 * 2 + 0x43648);
              goto LAB_00169065;
            }
          } while (-1 < (int)uVar8);
        }
        iVar5 = output_code(f,ocode);
        if (iVar5 != 0) {
          return iVar5;
        }
        *(uint *)((long)plVar3 + 0x65164) = (uint)bVar1;
        iVar5 = *(int *)((long)plVar3 + 0x6515c);
        if (iVar5 < (int)plVar3[4]) {
          *(int *)((long)plVar3 + 0x6515c) = iVar5 + 1;
          *(short *)((long)plVar3 + (long)(int)uVar10 * 2 + 0x43648) = (short)iVar5;
          *(int *)((long)plVar3 + (long)(int)uVar10 * 4 + 0x24) = (int)plVar3[0xca2d];
        }
        else {
          lVar6 = *plVar3;
          if (plVar3[2] <= lVar6) {
            plVar3[2] = lVar6 + 10000;
            lVar7 = plVar3[1];
            if (lVar6 < 0x800000) {
              if (lVar7 == 0) goto LAB_0016909c;
              lVar6 = lVar6 << 8;
LAB_00169095:
              iVar5 = (int)(lVar6 / lVar7);
            }
            else {
              lVar9 = lVar7 + 0xff;
              if (-1 < lVar7) {
                lVar9 = lVar7;
              }
              iVar5 = (int)((ulong)lVar9 >> 8);
              if (iVar5 != 0) {
                lVar7 = (long)iVar5;
                goto LAB_00169095;
              }
LAB_0016909c:
              iVar5 = 0x7fffffff;
            }
            if ((int)plVar3[0xca2c] < iVar5) {
              *(int *)(plVar3 + 0xca2c) = iVar5;
            }
            else {
              *(undefined4 *)(plVar3 + 0xca2c) = 0;
              memset((void *)((long)plVar3 + 0x24),0xff,0x43624);
              *(undefined4 *)((long)plVar3 + 0x6515c) = 0x101;
              iVar5 = output_code(f,0x100);
              if (iVar5 != 0) {
                return iVar5;
              }
            }
          }
        }
      }
      length = length - 1;
      buff = (void *)((long)buff + 1);
    } while (length != 0);
  }
  return 0;
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) | state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}